

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_randomize(Integer g_a,void *val)

{
  float fVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  Integer I_elems;
  char err_string [256];
  long local_140;
  char *local_138 [33];
  
  iVar5 = _ga_sync_end;
  bVar10 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  iVar3 = GA[g_a + 1000].p_handle;
  if (bVar10) {
    pnga_pgroup_sync((long)iVar3);
  }
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","ga_randomize");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","ga_randomize");
    pnga_error((char *)local_138,g_a);
  }
  iVar8 = (int)g_a + 1000;
  iVar6 = GA[iVar8].type;
  if ((0xff < iVar6 - 1000U) || (ga_types[iVar6 - 1000].active == 0)) {
    pnga_error("type not yet supported",(long)iVar6);
  }
  lVar7 = GA[iVar8].size / (long)GA[iVar8].elemsize;
  if (GA[iVar8].block_total < 0) {
    lVar9 = GAme;
    if (-1 < iVar3) {
      lVar9 = (long)PGRP_LIST[GA[iVar8].p_handle].map_proc_list[GAme];
    }
    local_138[0] = GA[iVar8].ptr[lVar9];
    iVar6 = GA[iVar8].type;
    switch(iVar6) {
    case 0x3e9:
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          iVar6 = *val;
          iVar8 = rand();
          *(int *)(local_138[0] + lVar9 * 4) =
               (int)((long)(iVar8 * iVar6) * 0x40000001 >> 0x3d) - (iVar8 * iVar6 >> 0x1f);
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    case 0x3ea:
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          lVar4 = *val;
          iVar6 = rand();
          *(long *)(local_138[0] + lVar9 * 8) = (iVar6 * lVar4) / 0x7fffffff;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    case 0x3eb:
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          fVar1 = *val;
          iVar6 = rand();
          *(float *)(local_138[0] + lVar9 * 4) = (float)iVar6 * fVar1 * 4.656613e-10;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    case 0x3ec:
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          dVar2 = *val;
          iVar6 = rand();
          *(double *)(local_138[0] + lVar9 * 8) = ((double)iVar6 * dVar2) / 2147483647.0;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    default:
      if (iVar6 == 0x3f8) {
        if (0 < lVar7) {
          lVar9 = 0;
          do {
            lVar4 = *val;
            iVar6 = rand();
            *(long *)(local_138[0] + lVar9 * 8) = (iVar6 * lVar4) / 0x7fffffff;
            lVar9 = lVar9 + 1;
          } while (lVar7 != lVar9);
        }
      }
      else {
        pnga_error("type not supported",(long)iVar6);
      }
    }
  }
  else {
    local_140 = lVar7;
    pnga_access_block_segment_ptr(g_a,GAme,local_138,&local_140);
    lVar7 = local_140;
    iVar6 = GA[iVar8].type;
    switch(iVar6) {
    case 0x3e9:
      if (0 < local_140) {
        lVar9 = 0;
        do {
          iVar6 = *val;
          iVar8 = rand();
          *(int *)(local_138[0] + lVar9 * 4) =
               (int)((long)(iVar8 * iVar6) * 0x40000001 >> 0x3d) - (iVar8 * iVar6 >> 0x1f);
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    case 0x3ea:
      if (0 < local_140) {
        lVar9 = 0;
        do {
          lVar4 = *val;
          iVar6 = rand();
          *(long *)(local_138[0] + lVar9 * 8) = (iVar6 * lVar4) / 0x7fffffff;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    case 0x3eb:
      if (0 < local_140) {
        lVar9 = 0;
        do {
          fVar1 = *val;
          iVar6 = rand();
          *(float *)(local_138[0] + lVar9 * 4) = (float)iVar6 * fVar1 * 4.656613e-10;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    case 0x3ec:
      if (0 < local_140) {
        lVar9 = 0;
        do {
          dVar2 = *val;
          iVar6 = rand();
          *(double *)(local_138[0] + lVar9 * 8) = ((double)iVar6 * dVar2) / 2147483647.0;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      break;
    default:
      if (iVar6 == 0x3f8) {
        if (0 < local_140) {
          lVar9 = 0;
          do {
            lVar4 = *val;
            iVar6 = rand();
            *(long *)(local_138[0] + lVar9 * 8) = (iVar6 * lVar4) / 0x7fffffff;
            lVar9 = lVar9 + 1;
          } while (lVar7 != lVar9);
        }
      }
      else {
        pnga_error("type not supported",(long)iVar6);
      }
    }
    pnga_release_block_segment(g_a,GAme);
  }
  if (iVar5 != 0) {
    pnga_pgroup_sync((long)iVar3);
  }
  return;
}

Assistant:

void pnga_randomize(Integer g_a, void* val)
{
  int i,handle=GA_OFFSET + (int)g_a;
  char *ptr;
  int local_sync_begin,local_sync_end;
  C_Long elems;
  Integer grp_id;
  Integer num_blocks;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);


  ga_check_handleM(g_a, "ga_randomize");
  gam_checktype(GA[handle].type);
  elems = GA[handle].size/((C_Long)GA[handle].elemsize);
  num_blocks = GA[handle].block_total;

  if (num_blocks < 0) {
    /* Bruce..Please CHECK if this is correct */
    if (grp_id >= 0){  
      Integer grp_me = PGRP_LIST[GA[handle].p_handle].map_proc_list[GAme];
      ptr = GA[handle].ptr[grp_me];
    }
    else  ptr = GA[handle].ptr[GAme];

    switch (GA[handle].type){
/*
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*) rand();
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
*/
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*) val * ((double)rand())/RAND_MAX;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*) val * ((int)rand())/RAND_MAX;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*) val * ((float)rand())/(size_t)RAND_MAX;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*) val * ((long)rand())/RAND_MAX;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*( long long*) val * ((long long)rand())/RAND_MAX;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
  } else {
    Integer I_elems = (Integer)elems;
    pnga_access_block_segment_ptr(g_a,GAme,&ptr,&I_elems);
    elems = (C_Long)I_elems;
    switch (GA[handle].type){
/*
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
*/
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val * ((double)rand())/RAND_MAX;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val * ((int)rand())/RAND_MAX;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val * ((float)rand())/(size_t)RAND_MAX;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val * ((long)rand())/RAND_MAX;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*(long long*)val * ((long long)rand())/RAND_MAX;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
    pnga_release_block_segment(g_a,GAme);
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

}